

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

void wallet::MaybePushAddress(UniValue *entry,CTxDestination *dest)

{
  long lVar1;
  bool bVar2;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffff18;
  CTxDestination *in_stack_ffffffffffffff20;
  UniValue *val;
  UniValue *in_stack_ffffffffffffff58;
  UniValue *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValidDestination(in_stack_ffffffffffffff20);
  if (bVar2) {
    val = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
               (allocator<char> *)in_stack_ffffffffffffff58);
    EncodeDestination_abi_cxx11_((CTxDestination *)in_RDI);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_ffffffffffffff58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
    UniValue::pushKV(in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58,val);
    UniValue::~UniValue(in_stack_ffffffffffffff18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void MaybePushAddress(UniValue & entry, const CTxDestination &dest)
{
    if (IsValidDestination(dest)) {
        entry.pushKV("address", EncodeDestination(dest));
    }
}